

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O1

void __thiscall TilesBoard::deleteTiles(TilesBoard *this)

{
  pointer puVar1;
  pointer puVar2;
  QPushButton *pQVar3;
  pointer ppQVar4;
  long *plVar5;
  pointer *__ptr;
  pointer puVar6;
  
  puVar1 = (this->tiles).
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->tiles).
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pQVar3 = (puVar6->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
               _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
      if (pQVar3 != (QPushButton *)0x0) {
        (**(code **)(*(long *)pQVar3 + 0x20))();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
      super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
      super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl = (QPushButton *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
    (this->tiles).
    super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  plVar5 = (long *)(**(code **)(*(long *)this->verticalLayout + 0xb0))(this->verticalLayout,0);
  while (plVar5 != (long *)0x0) {
    QLayout::removeItem((QLayoutItem *)this->verticalLayout);
    (**(code **)(*plVar5 + 8))(plVar5);
    plVar5 = (long *)(**(code **)(*(long *)this->verticalLayout + 0xb0))(this->verticalLayout,0);
  }
  ppQVar4 = (this->horizontalLayouts).
            super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->horizontalLayouts).super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppQVar4) {
    (this->horizontalLayouts).super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppQVar4;
  }
  return;
}

Assistant:

void TilesBoard::deleteTiles()
{
    tiles.clear();

    QLayoutItem* item;
    while (( item = verticalLayout->takeAt( 0 )))
    {
        verticalLayout->removeItem( 0 );
        delete item;
    }
    horizontalLayouts.clear();
}